

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O1

char * iniparser_getsecname(dictionary *d,int n)

{
  long lVar1;
  char **ppcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  pcVar5 = (char *)0x0;
  iVar6 = 0;
  if (-1 < n && d != (dictionary *)0x0) {
    lVar1 = d->size;
    if (lVar1 < 1) {
      lVar8 = 0;
    }
    else {
      ppcVar2 = d->key;
      lVar7 = 0;
      iVar6 = 0;
      do {
        if (((ppcVar2[lVar7] != (char *)0x0) &&
            (pcVar5 = strchr(ppcVar2[lVar7],0x3a), pcVar5 == (char *)0x0)) &&
           (iVar4 = iVar6 + 1, bVar3 = n <= iVar6, lVar8 = lVar7, iVar6 = iVar4, bVar3)) break;
        lVar7 = lVar7 + 1;
        lVar8 = lVar1;
      } while (lVar1 != lVar7);
    }
    if (n < iVar6) {
      pcVar5 = d->key[lVar8];
    }
    else {
      pcVar5 = (char *)0x0;
    }
  }
  return pcVar5;
}

Assistant:

const char * iniparser_getsecname(const dictionary * d, int n)
{
    int i ;
    int foundsec ;

    if (d==NULL || n<0) return NULL ;
    foundsec=0 ;
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        if (strchr(d->key[i], ':')==NULL) {
            foundsec++ ;
            if (foundsec>n)
                break ;
        }
    }
    if (foundsec<=n) {
        return NULL ;
    }
    return d->key[i] ;
}